

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O3

void __thiscall miniros::Publication::processPublishQueue(Publication *this)

{
  mutex *__mutex;
  pointer pSVar1;
  int iVar2;
  pointer m;
  V_SerializedMessage queue;
  vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_> local_38;
  
  local_38.
  super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>.
  _M_impl.super__Vector_impl_data._M_start = (SerializedMessage *)0x0;
  local_38.
  super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (SerializedMessage *)0x0;
  local_38.
  super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &this->publish_queue_mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    if (this->dropped_ == false) {
      std::vector<miniros::SerializedMessage,std::allocator<miniros::SerializedMessage>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<miniros::SerializedMessage*,std::vector<miniros::SerializedMessage,std::allocator<miniros::SerializedMessage>>>>
                ((vector<miniros::SerializedMessage,std::allocator<miniros::SerializedMessage>> *)
                 &local_38,0,
                 (this->publish_queue_).
                 super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->publish_queue_).
                 super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::
      _M_erase_at_end(&this->publish_queue_,
                      (this->publish_queue_).
                      super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pSVar1 = local_38.
               super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (m = local_38.
               super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>
               ._M_impl.super__Vector_impl_data._M_start; m != pSVar1; m = m + 1) {
        enqueueMessage(this,m);
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::~vector
              (&local_38);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void Publication::processPublishQueue()
{
  V_SerializedMessage queue;
  {
    std::scoped_lock<std::mutex> lock(publish_queue_mutex_);

    if (dropped_)
    {
      return;
    }

    queue.insert(queue.end(), publish_queue_.begin(), publish_queue_.end());
    publish_queue_.clear();
  }

  if (queue.empty())
  {
    return;
  }

  V_SerializedMessage::iterator it = queue.begin();
  V_SerializedMessage::iterator end = queue.end();
  for (; it != end; ++it)
  {
    enqueueMessage(*it);
  }
}